

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest9::verifyXFBData(FunctionalTest9 *this,GLvoid *data_ptr)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  float *pfVar6;
  TestLog *this_00;
  MessageBuilder *pMVar7;
  float fVar8;
  MessageBuilder local_1c0;
  uint local_40;
  undefined1 local_3c [4];
  uint n_component;
  Vec4 expected_result;
  uint n_point;
  GLfloat *traveller_ptr;
  bool should_continue;
  float epsilon;
  GLvoid *data_ptr_local;
  FunctionalTest9 *this_local;
  
  bVar4 = true;
  expected_result.m_data[2] = 0.0;
  unique0x1000047b = (float *)data_ptr;
  do {
    bVar3 = false;
    if ((uint)expected_result.m_data[2] < this->m_n_points_to_draw) {
      bVar3 = bVar4;
    }
    if (!bVar3) {
      return;
    }
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_3c,0.0,1.0,2.0,3.0);
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      uVar5 = (ulong)(uint)expected_result.m_data[2];
      pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_3c,local_40);
      *pfVar6 = (float)uVar5 + 0.123 + *pfVar6;
    }
    pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_3c,0);
    fVar8 = *pfVar6;
    pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_3c,1);
    fVar1 = *pfVar6;
    pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_3c,2);
    fVar2 = *pfVar6;
    pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_3c,3);
    *pfVar6 = fVar8 + fVar1 + fVar2 + *pfVar6;
    pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_3c,0);
    fVar8 = de::abs<float>(*pfVar6 - *stack0xffffffffffffffd8);
    if (1e-05 < fVar8) {
LAB_01020422:
      this_00 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_1c0,(char (*) [34])"XFBed data is invalid. Expected:(");
      pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_3c,0);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pfVar6);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
      pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_3c,1);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pfVar6);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
      pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_3c,2);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pfVar6);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
      pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_3c,3);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pfVar6);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [11])"), found:(");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,stack0xffffffffffffffd8);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,stack0xffffffffffffffd8 + 1);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,stack0xffffffffffffffd8 + 2);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,stack0xffffffffffffffd8 + 3);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c23dab);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c0);
      this->m_has_test_passed = false;
      bVar4 = false;
    }
    else {
      pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_3c,1);
      fVar8 = de::abs<float>(*pfVar6 - stack0xffffffffffffffd8[1]);
      if (1e-05 < fVar8) goto LAB_01020422;
      pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_3c,2);
      fVar8 = de::abs<float>(*pfVar6 - stack0xffffffffffffffd8[2]);
      if (1e-05 < fVar8) goto LAB_01020422;
      pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_3c,3);
      fVar8 = de::abs<float>(*pfVar6 - stack0xffffffffffffffd8[3]);
      if (1e-05 < fVar8) goto LAB_01020422;
    }
    register0x00000000 = stack0xffffffffffffffd8 + 4;
    expected_result.m_data[2] = (float)((int)expected_result.m_data[2] + 1);
  } while( true );
}

Assistant:

void FunctionalTest9::verifyXFBData(const glw::GLvoid* data_ptr)
{
	const float			epsilon			= 1e-5f;
	bool				should_continue = true;
	const glw::GLfloat* traveller_ptr   = (const glw::GLfloat*)data_ptr;

	for (unsigned int n_point = 0; n_point < m_n_points_to_draw && should_continue; ++n_point)
	{
		tcu::Vec4 expected_result(0, 1, 2, 3);

		for (unsigned int n_component = 0; n_component < 3 /* xyz */; ++n_component)
		{
			expected_result[n_component] += 0.123f + float(n_point);
		}

		expected_result[3 /* w */] += expected_result[0] + expected_result[1] + expected_result[2];

		if (de::abs(expected_result[0] - traveller_ptr[0]) > epsilon ||
			de::abs(expected_result[1] - traveller_ptr[1]) > epsilon ||
			de::abs(expected_result[2] - traveller_ptr[2]) > epsilon ||
			de::abs(expected_result[3] - traveller_ptr[3]) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "XFBed data is invalid. Expected:"
														   "("
							   << expected_result[0] << ", " << expected_result[1] << ", " << expected_result[2] << ", "
							   << expected_result[3] << "), found:(" << traveller_ptr[0] << ", " << traveller_ptr[1]
							   << ", " << traveller_ptr[2] << ", " << traveller_ptr[3] << ")."
							   << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
			should_continue   = false;
		}

		traveller_ptr += 4; /* xyzw */
	}						/* for (all rendered points) */
}